

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O2

void Saig_ManBmcWriteBlif(Aig_Man_t *p,Vec_Int_t *vMapping,char *pFileName)

{
  FILE *__s;
  void *pvVar1;
  ushort *puVar2;
  ulong uVar3;
  int iVar4;
  char cVar5;
  uint i;
  char *pcVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  char **pSops;
  char Vals [4];
  char *pSopSizes;
  ulong local_38;
  
  pcVar6 = pFileName;
  __s = fopen(pFileName,"w");
  if (__s != (FILE *)0x0) {
    fwrite(".model test\n",0xc,1,__s);
    fwrite(".inputs",7,1,__s);
    for (iVar4 = 0; iVar4 < p->vCis->nSize; iVar4 = iVar4 + 1) {
      pvVar1 = Vec_PtrEntry(p->vCis,iVar4);
      fprintf(__s," n%d",(ulong)*(uint *)((long)pvVar1 + 0x24));
    }
    fputc(10,__s);
    fwrite(".outputs",8,1,__s);
    for (iVar4 = 0; iVar4 < p->vCos->nSize; iVar4 = iVar4 + 1) {
      pvVar1 = Vec_PtrEntry(p->vCos,iVar4);
      fprintf(__s," n%d",(ulong)*(uint *)((long)pvVar1 + 0x24));
    }
    fputc(10,__s);
    fwrite(".names",6,1,__s);
    fprintf(__s," n%d\n",(ulong)(uint)p->pConst1->Id);
    fwrite(" 1\n",3,1,__s);
    Cnf_ReadMsops(&pSopSizes,&pSops);
    for (i = 0; (int)i < p->vObjs->nSize; i = i + 1) {
      pvVar1 = Vec_PtrEntry(p->vObjs,i);
      if ((pvVar1 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar1 + 0x18) & 7) - 7)) {
        iVar4 = Vec_IntEntry(vMapping,i);
        if (iVar4 != 0) {
          iVar4 = Vec_IntEntry(vMapping,i);
          puVar2 = (ushort *)Vec_IntEntryP(vMapping,iVar4);
          fwrite(".names",6,1,__s);
          lVar7 = 0;
          while ((lVar7 != 4 && (-1 < *(int *)(puVar2 + lVar7 * 2 + 2)))) {
            fprintf(__s," n%d");
            lVar7 = lVar7 + 1;
          }
          fprintf(__s," n%d\n",(ulong)i);
          local_38 = (ulong)*puVar2;
          for (lVar9 = 0; lVar9 < pSopSizes[local_38]; lVar9 = lVar9 + 1) {
            iVar4 = (int)pSops[local_38][lVar9];
            for (uVar3 = 3; -1 < (int)uVar3; uVar3 = (ulong)((int)uVar3 - 1)) {
              cVar5 = (iVar4 % 3 == 1) * '\x04' + '-';
              if (iVar4 % 3 == 0) {
                cVar5 = '0';
              }
              Vals[uVar3] = cVar5;
              iVar4 = iVar4 / 3;
            }
            for (lVar8 = 0; lVar7 != lVar8; lVar8 = lVar8 + 1) {
              fputc((int)Vals[lVar8],__s);
            }
            fwrite(" 1\n",3,1,__s);
          }
        }
      }
    }
    free(pSopSizes);
    free(pSops[1]);
    free(pSops);
    for (iVar4 = 0; iVar4 < p->vCos->nSize; iVar4 = iVar4 + 1) {
      pvVar1 = Vec_PtrEntry(p->vCos,iVar4);
      fwrite(".names",6,1,__s);
      fprintf(__s," n%d",
              (ulong)*(uint *)((*(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe) + 0x24));
      fprintf(__s," n%d\n",(ulong)*(uint *)((long)pvVar1 + 0x24));
      fprintf(__s,"%d 1\n",(ulong)(~*(uint *)((long)pvVar1 + 8) & 1));
    }
    fwrite(".end\n",5,1,__s);
    fclose(__s);
    return;
  }
  Abc_Print((int)pcVar6,"Cannot open file %s\n",pFileName);
  return;
}

Assistant:

void Saig_ManBmcWriteBlif( Aig_Man_t * p, Vec_Int_t * vMapping, char * pFileName )
{
    FILE * pFile;
    char * pSopSizes, ** pSops;
    Aig_Obj_t * pObj;
    char Vals[4];
    int i, k, b, iFan, iTruth, * pData;
    pFile = fopen( pFileName, "w" );
    if ( pFile == NULL )
    {
        Abc_Print( 1, "Cannot open file %s\n", pFileName );
        return;
    }
    fprintf( pFile, ".model test\n" );
    fprintf( pFile, ".inputs" );
    Aig_ManForEachCi( p, pObj, i )
        fprintf( pFile, " n%d", Aig_ObjId(pObj) );
    fprintf( pFile, "\n" );
    fprintf( pFile, ".outputs" );
    Aig_ManForEachCo( p, pObj, i )
        fprintf( pFile, " n%d", Aig_ObjId(pObj) );
    fprintf( pFile, "\n" );
    fprintf( pFile, ".names" );
    fprintf( pFile, " n%d\n", Aig_ObjId(Aig_ManConst1(p)) );
    fprintf( pFile, " 1\n" );

    Cnf_ReadMsops( &pSopSizes, &pSops );
    Aig_ManForEachNode( p, pObj, i )
    {
        if ( Vec_IntEntry(vMapping, i) == 0 )
            continue;
        pData = Vec_IntEntryP( vMapping, Vec_IntEntry(vMapping, i) );
        fprintf( pFile, ".names" );
        for ( iFan = 0; iFan < 4; iFan++ )
            if ( pData[iFan+1] >= 0 )
                fprintf( pFile, " n%d", pData[iFan+1] );
            else
                break;
        fprintf( pFile, " n%d\n", i );
        // write SOP
        iTruth = pData[0] & 0xffff;
        for ( k = 0; k < pSopSizes[iTruth]; k++ )
        {
            int Lit = pSops[iTruth][k];
            for ( b = 3; b >= 0; b-- )
            {
                if ( Lit % 3 == 0 )
                    Vals[b] = '0';
                else if ( Lit % 3 == 1 )
                    Vals[b] = '1';
                else
                    Vals[b] = '-';
                Lit = Lit / 3;
            }
            for ( b = 0; b < iFan; b++ )
                fprintf( pFile, "%c", Vals[b] );
            fprintf( pFile, " 1\n" );
        }
    }
    free( pSopSizes );
    free( pSops[1] );
    free( pSops );

    Aig_ManForEachCo( p, pObj, i )
    {
        fprintf( pFile, ".names" );
        fprintf( pFile, " n%d", Aig_ObjId(Aig_ObjFanin0(pObj)) );
        fprintf( pFile, " n%d\n", Aig_ObjId(pObj) );
        fprintf( pFile, "%d 1\n", !Aig_ObjFaninC0(pObj) );
    }
    fprintf( pFile, ".end\n" );
    fclose( pFile );
}